

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.cpp
# Opt level: O3

bool __thiscall CGI::CheckCGI(CGI *this,CharContent *cgi_string,Response *response)

{
  CGI *this_00;
  Response *response_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  CharContent temp;
  vector<CharContent,_std::allocator<CharContent>_> headers_line;
  CharContent local_f0;
  CGI *local_c8;
  Response *local_c0;
  vector<CharContent,_std::allocator<CharContent>_> local_b8;
  vector<CharContent,_std::allocator<CharContent>_> local_98;
  CharContent local_80;
  CharContent local_58;
  
  sVar2 = CharContent::length(cgi_string);
  if (sVar2 == 0) {
    bVar1 = false;
  }
  else {
    local_b8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = false;
    sVar2 = 0;
    local_c8 = this;
    local_c0 = response;
    do {
      sVar3 = CharContent::find(cgi_string,"\n",1,sVar2);
      if (sVar3 == cgi_string->npos) break;
      CharContent::subCharContent(&local_f0,cgi_string,sVar2,sVar3 - sVar2);
      CharContent::CharContent(&local_80,"\r");
      CharContent::strip(&local_58,&local_f0,&local_80);
      CharContent::operator=(&local_f0,&local_58);
      local_58._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      if (local_58.m != (char *)0x0) {
        operator_delete__(local_58.m);
      }
      local_80._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      if (local_80.m != (char *)0x0) {
        operator_delete__(local_80.m);
      }
      sVar4 = CharContent::length(&local_f0);
      if (sVar4 == 0) {
        bVar1 = true;
      }
      else {
        std::vector<CharContent,_std::allocator<CharContent>_>::push_back(&local_b8,&local_f0);
        sVar2 = sVar3 + 1;
      }
      local_f0._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      if (local_f0.m != (char *)0x0) {
        operator_delete__(local_f0.m);
      }
    } while (sVar4 != 0);
    if (bVar1) {
      sVar2 = CharContent::length(cgi_string);
      CharContent::subCharContent(&local_f0,cgi_string,sVar3 + 1,sVar2 + ~sVar3);
      response_00 = local_c0;
      CharContent::operator=(&local_c0->Entity,&local_f0);
      this_00 = local_c8;
      local_f0._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      if (local_f0.m != (char *)0x0) {
        operator_delete__(local_f0.m);
      }
      std::vector<CharContent,_std::allocator<CharContent>_>::vector(&local_98,&local_b8);
      bVar1 = check_header(this_00,&local_98,response_00);
      std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_98);
    }
    else {
      bVar1 = false;
    }
    std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_b8);
  }
  return bVar1;
}

Assistant:

bool CGI::CheckCGI(CharContent cgi_string,Response *response){
	if(cgi_string.length()==0)
		return false;
	bool one_line_space=false;
	std::vector<CharContent> headers_line;
	size_t pos=0,start=0;
	while((pos=cgi_string.find("\n",1,start))!=cgi_string.npos){
		CharContent temp=cgi_string.subCharContent(start,pos-start);
		temp=temp.strip("\r");
		if(temp.length()==0){
			one_line_space=true;
			break;
		}
		headers_line.push_back(temp);
		start=pos+1;
	}
	if(!one_line_space)
		return false;
	response->Entity=cgi_string.subCharContent(pos+1,cgi_string.length()-pos-1);
	return this->check_header(headers_line,response);
}